

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::AddTargetDepends
          (cmGlobalGenerator *this,cmGeneratorTarget *target,TargetDependSet *projectTargets)

{
  TargetDependSet *pTVar1;
  _Base_ptr p_Var2;
  pair<std::_Rb_tree_iterator<cmTargetDepend>,_bool> pVar3;
  cmTargetDepend local_48;
  
  local_48.Link = false;
  local_48.Util = false;
  local_48.Backtrace.TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.Backtrace.TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48.Target = target;
  pVar3 = std::
          _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
          ::_M_insert_unique<cmTargetDepend>
                    ((_Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                      *)projectTargets,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.Backtrace.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pTVar1 = GetTargetDirectDepends(this,target);
    for (p_Var2 = (pTVar1->
                  super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                  )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 !=
        &(pTVar1->
         super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>)._M_t
         ._M_impl.super__Rb_tree_header; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      AddTargetDepends(this,*(cmGeneratorTarget **)(p_Var2 + 1),projectTargets);
    }
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddTargetDepends(cmGeneratorTarget const* target,
                                         TargetDependSet& projectTargets)
{
  // add the target itself
  if (projectTargets.insert(target).second) {
    // This is the first time we have encountered the target.
    // Recursively follow its dependencies.
    TargetDependSet const& ts = this->GetTargetDirectDepends(target);
    for (auto const& t : ts) {
      this->AddTargetDepends(t, projectTargets);
    }
  }
}